

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::MergeFrom
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *from)

{
  bool bVar1;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior TVar2;
  LogMessage *other;
  uint64 uVar3;
  InternalMetadataWithArenaLite *this_00;
  double dVar4;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  TreeEnsembleParameters_TreeNode *local_58;
  TreeEnsembleParameters_TreeNode *from_local;
  TreeEnsembleParameters_TreeNode *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x308);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (TreeEnsembleParameters_TreeNode *)&local_58->_internal_metadata_;
  local_40 = this_00;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_00,&local_20->unknown_fields);
  }
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::MergeFrom
            (&this->evaluationinfo_,&local_58->evaluationinfo_);
  uVar3 = treeid(local_58);
  if (uVar3 != 0) {
    uVar3 = treeid(local_58);
    set_treeid(this,uVar3);
  }
  uVar3 = nodeid(local_58);
  if (uVar3 != 0) {
    uVar3 = nodeid(local_58);
    set_nodeid(this,uVar3);
  }
  TVar2 = nodebehavior(local_58);
  if (TVar2 != TreeEnsembleParameters_TreeNode_TreeNodeBehavior_BranchOnValueLessThanEqual) {
    TVar2 = nodebehavior(local_58);
    set_nodebehavior(this,TVar2);
  }
  bVar1 = missingvaluetrackstruechild(local_58);
  if (bVar1) {
    bVar1 = missingvaluetrackstruechild(local_58);
    set_missingvaluetrackstruechild(this,bVar1);
  }
  uVar3 = branchfeatureindex(local_58);
  if (uVar3 != 0) {
    uVar3 = branchfeatureindex(local_58);
    set_branchfeatureindex(this,uVar3);
  }
  dVar4 = branchfeaturevalue(local_58);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar4 = branchfeaturevalue(local_58);
    set_branchfeaturevalue(this,dVar4);
  }
  uVar3 = truechildnodeid(local_58);
  if (uVar3 != 0) {
    uVar3 = truechildnodeid(local_58);
    set_truechildnodeid(this,uVar3);
  }
  uVar3 = falsechildnodeid(local_58);
  if (uVar3 != 0) {
    uVar3 = falsechildnodeid(local_58);
    set_falsechildnodeid(this,uVar3);
  }
  dVar4 = relativehitrate(local_58);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar4 = relativehitrate(local_58);
    set_relativehitrate(this,dVar4);
  }
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::MergeFrom(const TreeEnsembleParameters_TreeNode& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  evaluationinfo_.MergeFrom(from.evaluationinfo_);
  if (from.treeid() != 0) {
    set_treeid(from.treeid());
  }
  if (from.nodeid() != 0) {
    set_nodeid(from.nodeid());
  }
  if (from.nodebehavior() != 0) {
    set_nodebehavior(from.nodebehavior());
  }
  if (from.missingvaluetrackstruechild() != 0) {
    set_missingvaluetrackstruechild(from.missingvaluetrackstruechild());
  }
  if (from.branchfeatureindex() != 0) {
    set_branchfeatureindex(from.branchfeatureindex());
  }
  if (from.branchfeaturevalue() != 0) {
    set_branchfeaturevalue(from.branchfeaturevalue());
  }
  if (from.truechildnodeid() != 0) {
    set_truechildnodeid(from.truechildnodeid());
  }
  if (from.falsechildnodeid() != 0) {
    set_falsechildnodeid(from.falsechildnodeid());
  }
  if (from.relativehitrate() != 0) {
    set_relativehitrate(from.relativehitrate());
  }
}